

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mipmapped_texture::is_normal_map(mipmapped_texture *this)

{
  bool bVar1;
  pixel_format fmt;
  image_u8 *piVar2;
  char *pcVar3;
  dxt_image *this_00;
  undefined1 local_50 [8];
  image_u8 tmp;
  mip_level *pLevel;
  mipmapped_texture *this_local;
  
  bVar1 = is_valid(this);
  if (bVar1) {
    fmt = get_format(this);
    bVar1 = pixel_format_helpers::is_normal_map(fmt);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      tmp.m_pixel_buf._8_8_ = get_level(this,0,0);
      piVar2 = mip_level::get_image((mip_level *)tmp.m_pixel_buf._8_8_);
      if (piVar2 == (image_u8 *)0x0) {
        image<crnlib::color_quad<unsigned_char,_int>_>::image
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_50);
        this_00 = mip_level::get_dxt_image((mip_level *)tmp.m_pixel_buf._8_8_);
        dxt_image::unpack(this_00,(image_u8 *)local_50);
        pcVar3 = dynamic_string::get_ptr(&this->m_name);
        this_local._7_1_ = image_utils::is_normal_map((image_u8 *)local_50,pcVar3);
        image<crnlib::color_quad<unsigned_char,_int>_>::~image
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_50);
      }
      else {
        piVar2 = mip_level::get_image((mip_level *)tmp.m_pixel_buf._8_8_);
        pcVar3 = dynamic_string::get_ptr(&this->m_name);
        this_local._7_1_ = image_utils::is_normal_map(piVar2,pcVar3);
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool mipmapped_texture::is_normal_map() const {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  if (pixel_format_helpers::is_normal_map(get_format()))
    return true;

  const mip_level* pLevel = get_level(0, 0);

  if (pLevel->get_image())
    return image_utils::is_normal_map(*pLevel->get_image(), m_name.get_ptr());

  image_u8 tmp;
  pLevel->get_dxt_image()->unpack(tmp);
  return image_utils::is_normal_map(tmp, m_name.get_ptr());
}